

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTBinaryComparisionExpression.cpp
# Opt level: O2

int __thiscall
MathML::AST::BinaryComparisonExpression::clone
          (BinaryComparisonExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  INode *pIVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar4;
  
  puVar3 = (undefined8 *)operator_new(0x20);
  *puVar3 = &PTR__BinaryComparisonExpression_00a058d8;
  *(Operator *)(puVar3 + 3) = this->mOperator;
  pIVar1 = this->mLeftOperand;
  if (pIVar1 == (INode *)0x0) {
    uVar4 = 0;
  }
  else {
    iVar2 = (*pIVar1->_vptr_INode[4])(pIVar1,(ulong)__fn & 0xffffffff);
    uVar4 = CONCAT44(extraout_var,iVar2);
  }
  puVar3[1] = uVar4;
  pIVar1 = this->mRightOperand;
  if (pIVar1 == (INode *)0x0) {
    uVar4 = 0;
  }
  else {
    iVar2 = (*pIVar1->_vptr_INode[4])(pIVar1,(ulong)__fn & 0xffffffff);
    uVar4 = CONCAT44(extraout_var_00,iVar2);
  }
  puVar3[2] = uVar4;
  return (int)puVar3;
}

Assistant:

INode* BinaryComparisonExpression::clone(CloneFlags cloneFlags) const
        {
            BinaryComparisonExpression* copy = new BinaryComparisonExpression();
            copy->mOperator = mOperator;

            if ( mLeftOperand )
                copy->mLeftOperand = mLeftOperand->clone(cloneFlags);
            else
                copy->mLeftOperand = 0;

            if ( mRightOperand )
                copy->mRightOperand = mRightOperand->clone(cloneFlags);
            else
                copy->mRightOperand = 0;

            return copy;
        }